

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
          (ContainerExprPBase<tcu::Vector<float,_3>_> *this,int i)

{
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  ExprP<float> EVar1;
  ExprP<tcu::Vector<float,_3>_> local_30;
  int local_1c;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_> *pSStack_18;
  int i_local;
  ContainerExprPBase<tcu::Vector<float,_3>_> *this_local;
  
  pSStack_18 = (SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_> *)
               CONCAT44(in_register_00000034,i);
  local_1c = in_EDX;
  this_local = this;
  exprP<tcu::Vector<float,3>>((BuiltinPrecisionTests *)&local_30,pSStack_18);
  Functions::getComponent<tcu::Vector<float,3>>((Functions *)this,&local_30,local_1c);
  ExprP<tcu::Vector<float,_3>_>::~ExprP(&local_30);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<typename T::Element> ContainerExprPBase<T>::operator[] (int i) const
{
	return Functions::getComponent(exprP<T>(*this), i);
}